

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
int_writer<unsigned_long,fmt::v5::basic_format_specs<wchar_t>>::num_writer::operator()
          (num_writer *this,wchar_t **it)

{
  int num_digits;
  unsigned_long value;
  add_thousands_sep<wchar_t> sep;
  basic_string_view<wchar_t> sep_00;
  wchar_t *pwVar1;
  add_thousands_sep<wchar_t> local_40;
  undefined1 local_28 [8];
  basic_string_view<wchar_t> s;
  wchar_t **it_local;
  num_writer *this_local;
  
  s.size_ = (size_t)it;
  basic_string_view<wchar_t>::basic_string_view
            ((basic_string_view<wchar_t> *)local_28,(wchar_t *)(this + 0xc),1);
  pwVar1 = *(wchar_t **)s.size_;
  value = *(unsigned_long *)this;
  num_digits = *(int *)(this + 8);
  sep_00.size_ = (size_t)s.data_;
  sep_00.data_ = (wchar_t *)local_28;
  internal::add_thousands_sep<wchar_t>::add_thousands_sep(&local_40,sep_00);
  sep.sep_.size_ = local_40.sep_.size_;
  sep.sep_.data_ = local_40.sep_.data_;
  sep.digit_index_ = local_40.digit_index_;
  sep._20_4_ = local_40._20_4_;
  pwVar1 = internal::
           format_decimal<wchar_t,unsigned_long,wchar_t*,fmt::v5::internal::add_thousands_sep<wchar_t>>
                     (pwVar1,value,num_digits,sep);
  *(wchar_t **)s.size_ = pwVar1;
  return;
}

Assistant:

void operator()(It &&it) const {
        basic_string_view<char_type> s(&sep, SEP_SIZE);
        it = internal::format_decimal<char_type>(
              it, abs_value, size, internal::add_thousands_sep<char_type>(s));
      }